

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ALSADriver.cpp
# Opt level: O2

void __thiscall ALSAMidiDriver::start(ALSAMidiDriver *this)

{
  int iVar1;
  QDebug *this_00;
  QDebug QStack_48;
  QObject local_40 [8];
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  char *local_20;
  
  OSSMidiPortDriver::start(&this->rawMidiPortDriver);
  QObject::connect(local_40,(char *)this,
                   (QObject *)"2mainWindowTitleContributionUpdated(const QString &)",
                   (char *)(this->super_MidiDriver).master,0x173621);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  iVar1 = alsa_setup_midi(this);
  if (-1 < iVar1) {
    this->stopProcessing = false;
    iVar1 = pthread_create(&this->processingThreadID,(pthread_attr_t *)0x0,processingThread,this);
    if (iVar1 != 0) {
      this->processingThreadID = 0;
      local_38 = 2;
      local_24 = 0;
      local_34 = 0;
      uStack_2c = 0;
      local_20 = "default";
      QMessageLogger::debug();
      this_00 = QDebug::operator<<(&QStack_48,"ALSAMidiDriver: Processing Thread creation failed:");
      QDebug::operator<<(this_00,iVar1);
      QDebug::~QDebug(&QStack_48);
      snd_seq_close(this->snd_seq);
    }
  }
  return;
}

Assistant:

void ALSAMidiDriver::start() {
	rawMidiPortDriver.start();
	connect(this, SIGNAL(mainWindowTitleContributionUpdated(const QString &)), master, SLOT(updateMainWindowTitleContribution(const QString &)));
	if (alsa_setup_midi() < 0) return;
	stopProcessing = false;
	int error = pthread_create(&processingThreadID, NULL, processingThread, this);
	if (error != 0) {
		processingThreadID = 0;
		qDebug() << "ALSAMidiDriver: Processing Thread creation failed:" << error;
		snd_seq_close(snd_seq);
	}
}